

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_polymorphism.h
# Opt level: O2

void __thiscall density_tests::SingleDerivedNonPoly::check(SingleDerivedNonPoly *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  NonPolymorphicBase::check(&this->super_NonPolymorphicBase);
  std::operator+(&local_30,&this->m_str1,&this->m_str2);
  bVar1 = std::operator==(&local_30,"Hello world!!");
  std::__cxx11::string::~string((string *)&local_30);
  if (!bVar1) {
    detail::assert_failed<>
              ("m_str1 + m_str2 == \"Hello world!!\"",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
               ,0x27);
  }
  return;
}

Assistant:

void check()
        {
            NonPolymorphicBase::check();
            DENSITY_TEST_ASSERT(m_str1 + m_str2 == "Hello world!!");
        }